

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_MultiColumnAttributeTest_Test::TestSuite_MultiColumnAttributeTest_Test
          (TestSuite_MultiColumnAttributeTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001a6498;
  return;
}

Assistant:

TEST(TestSuite, MultiColumnAttributeTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE Bugs ("
      "bug_id      SERIAL PRIMARY KEY,"
      "description VARCHAR(1000),"
      "tag1        VARCHAR(20),"
      "tag2        VARCHAR(20),"
      "tag3        VARCHAR(20)"
      ");"

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}